

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isoent * isoent_find_entry(isoent *rootent,char *fn)

{
  int iVar1;
  int l;
  isoent *np;
  isoent *isoent;
  char name [256];
  char *fn_local;
  isoent *rootent_local;
  
  np = rootent;
  name._248_8_ = fn;
  do {
    iVar1 = get_path_component((char *)&isoent,0x100,(char *)name._248_8_);
    if (iVar1 == 0) {
      return (isoent *)0x0;
    }
    name._248_8_ = name._248_8_ + (long)iVar1;
    if (*(char *)name._248_8_ == '/') {
      name._248_8_ = name._248_8_ + 1;
    }
    np = isoent_find_child(np,(char *)&isoent);
    if (np == (isoent *)0x0) {
      return (isoent *)0x0;
    }
    if (*(char *)name._248_8_ == '\0') {
      return np;
    }
  } while (((byte)np->field_0xe8 >> 1 & 1) != 0);
  return (isoent *)0x0;
}

Assistant:

static struct isoent *
isoent_find_entry(struct isoent *rootent, const char *fn)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct isoent *isoent, *np;
	int l;

	isoent = rootent;
	np = NULL;
	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0)
			break;
		fn += l;
		if (fn[0] == '/')
			fn++;

		np = isoent_find_child(isoent, name);
		if (np == NULL)
			break;
		if (fn[0] == '\0')
			break;/* We found out the entry */

		/* Try sub directory. */
		isoent = np;
		np = NULL;
		if (!isoent->dir)
			break;/* Not directory */
	}

	return (np);
}